

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSign.c
# Opt level: O2

double * Cudd_CofMinterm(DdManager *dd,DdNode *node)

{
  uint uVar1;
  int iVar2;
  st__table *table;
  double *__ptr;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    lVar5 = 0x268;
    goto LAB_00626e70;
  }
  size = dd->size;
  __ptr = ddCofMintermAux(dd,node,table);
  iVar2 = size;
  if (__ptr == (double *)0x0) {
LAB_00626da2:
    pdVar3 = (double *)0x0;
  }
  else {
    lVar5 = (long)size;
    pdVar3 = (double *)malloc(lVar5 * 8 + 8);
    if (pdVar3 == (double *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      goto LAB_00626da2;
    }
    uVar1 = *(uint *)((ulong)node & 0xfffffffffffffffe);
    uVar4 = (ulong)uVar1;
    if (uVar4 == 0x7fffffff) {
      iVar8 = 1;
      uVar4 = 0x7fffffff;
    }
    else {
      iVar8 = dd->perm[uVar4];
    }
    uVar6 = 0;
    uVar7 = 0;
    if (0 < iVar2) {
      uVar7 = (ulong)(uint)iVar2;
    }
    pdVar9 = __ptr + -(long)iVar8;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      lVar10 = 0x7fffffff;
      if (uVar1 != 0x7fffffff) {
        lVar10 = (long)dd->perm[uVar4];
      }
      pdVar11 = __ptr + (iVar2 - iVar8);
      if (lVar10 <= (long)uVar6) {
        pdVar11 = pdVar9;
      }
      pdVar3[dd->invperm[uVar6]] = *pdVar11;
      pdVar9 = pdVar9 + 1;
    }
    pdVar3[lVar5] = __ptr[iVar2 - iVar8];
  }
  if ((__ptr != (double *)0x0) && (*(int *)(((ulong)node & 0xfffffffffffffffe) + 4) == 1)) {
    free(__ptr);
  }
  st__foreach(table,cuddStCountfree,(char *)0x0);
  st__free_table(table);
  if (pdVar3 != (double *)0x0) {
    return pdVar3;
  }
  lVar5 = 0x260;
LAB_00626e70:
  fwrite("out-of-memory, couldn\'t measure DD cofactors.\n",0x2e,1,
         *(FILE **)((long)&(dd->sentinel).index + lVar5));
  dd->errorCode = CUDD_MEMORY_OUT;
  return (double *)0x0;
}

Assistant:

double *
Cudd_CofMinterm(
  DdManager * dd,
  DdNode * node)
{
    st__table    *table;
    double      *values;
    double      *result = NULL;
    int         i, firstLevel;

#ifdef DD_STATS
    long startTime;
    startTime = util_cpu_time();
    num_calls = 0;
    table_mem = sizeof( st__table);
#endif

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        (void) fprintf(dd->err,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    size = dd->size;
    values = ddCofMintermAux(dd, node, table);
    if (values != NULL) {
        result = ABC_ALLOC(double,size + 1);
        if (result != NULL) {
#ifdef DD_STATS
            table_mem += (size + 1) * sizeof(double);
#endif
            if (Cudd_IsConstant(node))
                firstLevel = 1;
            else
                firstLevel = cuddI(dd,Cudd_Regular(node)->index);
            for (i = 0; i < size; i++) {
                if (i >= cuddI(dd,Cudd_Regular(node)->index)) {
                    result[dd->invperm[i]] = values[i - firstLevel];
                } else {
                    result[dd->invperm[i]] = values[size - firstLevel];
                }
            }
            result[size] = values[size - firstLevel];
        } else {
            dd->errorCode = CUDD_MEMORY_OUT;
        }
    }

#ifdef DD_STATS
    table_mem += table->num_bins * sizeof( st__table_entry *);
#endif
    if (Cudd_Regular(node)->ref == 1) ABC_FREE(values);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
#ifdef DD_STATS
    (void) fprintf(dd->out,"Number of calls: %d\tTable memory: %d bytes\n",
                  num_calls, table_mem);
    (void) fprintf(dd->out,"Time to compute measures: %s\n",
                  util_print_time(util_cpu_time() - startTime));
#endif
    if (result == NULL) {
        (void) fprintf(dd->out,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
    }
    return(result);

}